

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::internal::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  long lVar2;
  char cVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  byte bVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  undefined4 in_register_0000003c;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  char *__s;
  char format [7];
  char local_57 [7];
  long local_50;
  double local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_0000003c,precision);
  local_38 = (ulong)specs >> 0x20;
  uVar6 = 5;
  if (-1 < precision) {
    uVar6 = precision - 1;
  }
  bVar8 = specs._4_1_;
  uVar14 = (ulong)uVar6;
  if (1 < bVar8) {
    uVar14 = (ulong)(uint)precision;
  }
  local_57[0] = '%';
  if ((specs._4_4_ >> 0x15 & 1) == 0) {
    pbVar7 = (byte *)(local_57 + 1);
  }
  else {
    pbVar7 = (byte *)(local_57 + 2);
    local_57[1] = 0x23;
  }
  if (-1 < (int)uVar14) {
    pbVar7[0] = 0x2e;
    pbVar7[1] = 0x2a;
    pbVar7 = pbVar7 + 2;
  }
  if (bVar8 == 3) {
    bVar8 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar8 = (bVar8 == 2) + 0x65;
  }
  *pbVar7 = bVar8;
  pbVar7[1] = 0;
  sVar4 = buf->size_;
  local_50 = sVar4 + 1;
  local_48 = value;
LAB_0017693c:
  while( true ) {
    __s = buf->ptr_ + sVar4;
    uVar11 = buf->capacity_ - sVar4;
    if ((int)uVar14 < 0) {
      uVar6 = snprintf(__s,uVar11,local_57,local_48);
    }
    else {
      uVar6 = snprintf(__s,uVar11,local_57,local_48,uVar14);
    }
    uVar15 = (ulong)uVar6;
    if ((int)uVar6 < 0) goto LAB_0017699f;
    if (uVar15 < uVar11) break;
    uVar15 = local_50 + uVar15;
    if (buf->capacity_ < uVar15) goto LAB_001769ac;
  }
  if ((char)local_38 == '\x02') {
    if ((int)local_40 != 0) {
      lVar12 = -0x100000000;
      uVar14 = 1;
      do {
        lVar12 = lVar12 + 0x100000000;
        lVar10 = uVar14 + (uVar15 - 2);
        uVar14 = uVar14 - 1;
      } while ((byte)(__s[lVar10] - 0x30U) < 10);
      memmove(__s + uVar14 + uVar15 + -1,__s + uVar14 + uVar15,lVar12 >> 0x20);
      uVar11 = (ulong)(uVar6 - 1);
      if (buf->capacity_ < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
      }
      buf->size_ = uVar11;
      goto LAB_00176b31;
    }
    if (buf->capacity_ < uVar15) {
      (**buf->_vptr_buffer)(buf,uVar15);
    }
    buf->size_ = uVar15;
  }
  else {
    if (((uint)local_38 & 0xff) != 3) {
      lVar10 = (uVar15 << 0x20) + -0x100000000;
      lVar12 = 2;
      do {
        lVar10 = lVar10 + -0x100000000;
        lVar1 = lVar12 + (uVar15 - 3);
        lVar12 = lVar12 + -1;
      } while (__s[lVar1] != 'e');
      lVar1 = uVar15 + lVar12;
      pcVar9 = __s + lVar12 + uVar15 + -3;
      lVar2 = uVar15 + lVar12;
      iVar13 = 0;
      do {
        iVar13 = (int)__s[lVar12 + uVar15] + iVar13 * 10 + -0x30;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
      iVar5 = -iVar13;
      if (__s[lVar1 + -1] != '-') {
        iVar5 = iVar13;
      }
      uVar6 = 0;
      if (lVar1 != 3) {
        uVar14 = lVar2 - 3U & 0xffffffff;
        do {
          lVar10 = lVar10 + -0x100000000;
          uVar6 = (int)uVar14 - 1;
          uVar14 = (ulong)uVar6;
          cVar3 = *pcVar9;
          pcVar9 = pcVar9 + -1;
        } while (cVar3 == '0');
        memmove(__s + 1,__s + 2,lVar10 >> 0x20);
      }
      uVar14 = local_50 + (int)uVar6;
      if (buf->capacity_ < uVar14) {
        (**buf->_vptr_buffer)(buf,uVar14);
      }
      buf->size_ = uVar14;
      uVar14 = (ulong)(iVar5 - uVar6);
      goto LAB_00176b31;
    }
    uVar15 = sVar4 + uVar15;
    if (buf->capacity_ < uVar15) {
      (**buf->_vptr_buffer)(buf,uVar15);
    }
    buf->size_ = uVar15;
  }
  uVar14 = 0;
LAB_00176b31:
  return (int)uVar14;
LAB_0017699f:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar15 = buf->capacity_ + 1;
LAB_001769ac:
    (**buf->_vptr_buffer)(buf,uVar15);
  }
  goto LAB_0017693c;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>(), "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.trailing_zeros) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    auto snprintf_ptr = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    unsigned size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, fraction_size);
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, fraction_size);
    }
    buf.resize(fraction_size + offset + 1);
    return exp - fraction_size;
  }
}